

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_v_wasm.cpp
# Opt level: O2

JsType wasm::wasmToJsType(Type type)

{
  uint line;
  bool bVar1;
  BasicType BVar2;
  JsType JVar3;
  char *pcVar4;
  Type local_10;
  Type type_local;
  
  local_10.id = type.id;
  bVar1 = Type::isTuple(&local_10);
  if (bVar1) {
    pcVar4 = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00abbe0b:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                  ,0x18,"JsType wasm::wasmToJsType(Type)");
  }
  if (6 < local_10.id) {
    pcVar4 = "type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00abbe0b;
  }
  BVar2 = Type::getBasic(&local_10);
  switch(BVar2) {
  case none:
    JVar3 = JS_NONE;
    break;
  case unreachable:
    pcVar4 = "invalid type";
    line = 0x27;
    goto LAB_00abbe55;
  case i32:
    JVar3 = JS_INT;
    break;
  case i64:
    JVar3 = JS_INT64;
    break;
  case f32:
    JVar3 = JS_FLOAT;
    break;
  case f64:
    JVar3 = JS_DOUBLE;
    break;
  case v128:
    pcVar4 = "v128 not implemented yet";
    line = 0x23;
    goto LAB_00abbe55;
  default:
    pcVar4 = "invalid type";
    line = 0x29;
LAB_00abbe55:
    handle_unreachable(pcVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                       ,line);
  }
  return JVar3;
}

Assistant:

JsType wasmToJsType(Type type) {
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    case Type::i32:
      return JS_INT;
    case Type::f32:
      return JS_FLOAT;
    case Type::f64:
      return JS_DOUBLE;
    case Type::i64:
      return JS_INT64;
    case Type::v128:
      WASM_UNREACHABLE("v128 not implemented yet");
    case Type::none:
      return JS_NONE;
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}